

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_group_scrolled_end(nk_context *ctx)

{
  nk_rect r;
  nk_rect r_00;
  nk_cursor *in_RDI;
  nk_vec2 panel_padding;
  nk_window pan;
  nk_rect clip;
  nk_panel *g;
  nk_panel *parent;
  nk_window *win;
  nk_size in_stack_fffffffffffffdd8;
  void *in_stack_fffffffffffffde0;
  nk_context *ctx_00;
  nk_vec2 nVar1;
  float fVar2;
  float fVar3;
  undefined1 local_208 [72];
  undefined4 local_1c0;
  float local_1bc;
  float fStack_1b8;
  float local_1b4;
  float fStack_1b0;
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined1 local_1a0 [384];
  nk_key local_20;
  nk_cursor *local_18;
  nk_user_font *local_10;
  nk_cursor *local_8;
  
  if ((in_RDI != (nk_cursor *)0x0) && (in_RDI[0x19f].img.handle.ptr != (void *)0x0)) {
    local_10 = (nk_user_font *)in_RDI[0x19f].img.handle.ptr;
    local_20 = *(nk_key *)&local_10[4].height;
    local_18 = *(nk_cursor **)((long)local_20 + 0x1b8);
    local_8 = in_RDI;
    nk_zero(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    nVar1 = nk_panel_get_padding((nk_style *)(local_8 + 9),NK_PANEL_GROUP);
    fVar2 = nVar1.x;
    fVar3 = nVar1.y;
    fStack_1b8 = *(float *)((long)local_20 + 0xc) -
                 (*(float *)((long)local_20 + 0x38) + *(float *)((long)local_20 + 0x60));
    local_1bc = *(float *)((long)local_20 + 8) - fVar2;
    local_1b4 = fVar2 + fVar2 + *(float *)((long)local_20 + 0x10);
    fStack_1b0 = *(float *)((long)local_20 + 0x14) + *(float *)((long)local_20 + 0x38) +
                 *(float *)((long)local_20 + 0x60);
    if ((*(uint *)((long)local_20 + 4) & 1) != 0) {
      local_1bc = local_1bc - *(float *)((long)local_20 + 0x3c);
      fStack_1b8 = fStack_1b8 - *(float *)((long)local_20 + 0x3c);
      local_1b4 = *(float *)((long)local_20 + 0x3c) + *(float *)((long)local_20 + 0x3c) + local_1b4;
      fStack_1b0 = *(float *)((long)local_20 + 0x3c) + *(float *)((long)local_20 + 0x3c) +
                   fStack_1b0;
    }
    if ((*(uint *)((long)local_20 + 4) & 0x20) == 0) {
      local_1b4 = local_8[0xc3].size.y + local_1b4;
      fStack_1b0 = local_8[0xc3].offset.x + fStack_1b0;
    }
    local_1ac = **(undefined4 **)((long)local_20 + 0x18);
    local_1a8 = **(undefined4 **)((long)local_20 + 0x20);
    local_1c0 = *(undefined4 *)((long)local_20 + 4);
    ctx_00 = (nk_context *)local_1a0;
    local_1a0._0_8_ = local_10[2].query;
    local_1a0._8_8_ = local_10[2].texture;
    local_1a0._16_8_ = local_10[3].userdata;
    local_1a0._24_4_ = (nk_bool)local_10[3].height;
    local_1a0._28_4_ = *(uint *)&local_10[3].field_0xc;
    local_1a0._32_8_ = local_10[3].width;
    local_1a0._40_8_ = local_10[3].query;
    local_1a0._48_8_ = local_10[3].texture;
    local_1a0._56_8_ = local_10[4].userdata;
    local_1a0._64_4_ = local_20.down;
    local_1a0._68_4_ = local_20.clicked;
    local_1a0._360_8_ = local_10;
    local_8[0x19f].img.handle.ptr = local_208;
    nk_unify((nk_rect *)(local_1a0 + 0x170),(nk_rect *)&local_18[1].size.y,local_1bc,fStack_1b8,
             local_1bc + local_1b4,fStack_1b8 + fStack_1b0 + fVar2);
    r.w = fVar2;
    r.x = nVar1.x;
    r.y = nVar1.y;
    r.h = fVar3;
    nk_push_scissor((nk_command_buffer *)ctx_00,r);
    nk_end(ctx_00);
    local_10[3].texture = (nk_handle)local_1a0._48_8_;
    local_10[4].userdata = (nk_handle)local_1a0._56_8_;
    local_10[3].width = (nk_text_width_f)local_1a0._32_8_;
    local_10[3].query = (nk_query_font_glyph_f)local_1a0._40_8_;
    local_10[3].userdata = (nk_handle)local_1a0._16_8_;
    *(undefined8 *)&local_10[3].height = local_1a0._24_8_;
    local_10[2].query = (nk_query_font_glyph_f)local_1a0._0_8_;
    local_10[2].texture = (nk_handle)local_1a0._8_8_;
    r_00.w = fVar2;
    r_00.x = nVar1.x;
    r_00.y = nVar1.y;
    r_00.h = fVar3;
    nk_push_scissor((nk_command_buffer *)ctx_00,r_00);
    local_8[0x19f].img.handle.ptr = local_10;
    *(nk_cursor **)&local_10[4].height = local_18;
    *(ulong *)((long)local_20 + 8) = CONCAT44(fStack_1b8,local_1bc);
    *(ulong *)((long)local_20 + 0x10) = CONCAT44(fStack_1b0,local_1b4);
  }
  return;
}

Assistant:

NK_API void
nk_group_scrolled_end(struct nk_context *ctx)
{
struct nk_window *win;
struct nk_panel *parent;
struct nk_panel *g;

struct nk_rect clip;
struct nk_window pan;
struct nk_vec2 panel_padding;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
if (!ctx || !ctx->current)
return;

/* make sure nk_group_begin was called correctly */
NK_ASSERT(ctx->current);
win = ctx->current;
NK_ASSERT(win->layout);
g = win->layout;
NK_ASSERT(g->parent);
parent = g->parent;

/* dummy window */
nk_zero_struct(pan);
panel_padding = nk_panel_get_padding(&ctx->style, NK_PANEL_GROUP);
pan.bounds.y = g->bounds.y - (g->header_height + g->menu.h);
pan.bounds.x = g->bounds.x - panel_padding.x;
pan.bounds.w = g->bounds.w + 2 * panel_padding.x;
pan.bounds.h = g->bounds.h + g->header_height + g->menu.h;
if (g->flags & NK_WINDOW_BORDER) {
pan.bounds.x -= g->border;
pan.bounds.y -= g->border;
pan.bounds.w += 2*g->border;
pan.bounds.h += 2*g->border;
}
if (!(g->flags & NK_WINDOW_NO_SCROLLBAR)) {
pan.bounds.w += ctx->style.window.scrollbar_size.x;
pan.bounds.h += ctx->style.window.scrollbar_size.y;
}
pan.scrollbar.x = *g->offset_x;
pan.scrollbar.y = *g->offset_y;
pan.flags = g->flags;
pan.buffer = win->buffer;
pan.layout = g;
pan.parent = win;
ctx->current = &pan;

/* make sure group has correct clipping rectangle */
nk_unify(&clip, &parent->clip, pan.bounds.x, pan.bounds.y,
pan.bounds.x + pan.bounds.w, pan.bounds.y + pan.bounds.h + panel_padding.x);
nk_push_scissor(&pan.buffer, clip);
nk_end(ctx);

win->buffer = pan.buffer;
nk_push_scissor(&win->buffer, parent->clip);
ctx->current = win;
win->layout = parent;
g->bounds = pan.bounds;
return;
}